

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

CURLcode Curl_pp_flushsend(Curl_easy *data,pingpong *pp)

{
  CURLcode CVar1;
  size_t sVar2;
  curltime cVar3;
  size_t written;
  size_t local_10;
  
  sVar2 = pp->sendleft;
  if (sVar2 == 0) {
    return CURLE_OK;
  }
  CVar1 = Curl_conn_send(data,0,pp->sendthis + (pp->sendsize - sVar2),sVar2,false,&local_10);
  if (CVar1 == CURLE_AGAIN) {
    local_10 = 0;
  }
  else if (CVar1 != CURLE_OK) {
    return CVar1;
  }
  sVar2 = pp->sendleft - local_10;
  if (sVar2 == 0) {
    pp->sendthis = (char *)0x0;
    pp->sendleft = 0;
    pp->sendsize = 0;
    cVar3 = Curl_now();
    (pp->response).tv_sec = cVar3.tv_sec;
    (pp->response).tv_usec = cVar3.tv_usec;
  }
  else {
    pp->sendleft = sVar2;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_pp_flushsend(struct Curl_easy *data,
                           struct pingpong *pp)
{
  /* we have a piece of a command still left to send */
  size_t written;
  CURLcode result;

  if(!Curl_pp_needs_flush(data, pp))
    return CURLE_OK;

  result = Curl_conn_send(data, FIRSTSOCKET,
                          pp->sendthis + pp->sendsize - pp->sendleft,
                          pp->sendleft, FALSE, &written);
  if(result == CURLE_AGAIN) {
    result = CURLE_OK;
    written = 0;
  }
  if(result)
    return result;

  if(written != pp->sendleft) {
    /* only a fraction was sent */
    pp->sendleft -= written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }
  return CURLE_OK;
}